

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O2

void __thiscall
dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::Signal
          (Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this,string *name)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)name);
  SignalBase<int>::SignalBase(&this->super_SignalBase<int>,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_SignalBase<int>)._vptr_SignalBase = (_func_int **)&PTR__Signal_001357d8;
  this->signalType = CONSTANT;
  (this->Tcopy1).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Tcopy1).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  (this->Tcopy2).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Tcopy2).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  this->Tcopy = &this->Tcopy1;
  this->providerMutex = (Mutex *)0x0;
  this->Treference = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  this->TreferenceNonConst = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  (this->Tfunction).super_function_base.vtable = (vtable_base *)0x0;
  *(undefined8 *)&(this->Tfunction).super_function_base.functor = 0;
  *(undefined8 *)((long)&(this->Tfunction).super_function_base.functor + 8) = 0;
  *(undefined8 *)((long)&(this->Tfunction).super_function_base.functor + 0x10) = 0;
  this->keepReference = false;
  return;
}

Assistant:

Signal<T, Time>::Signal(std::string name)
    : __SIGNAL_INIT(name, T(), NULL, NULL, NULL) {
  return;
}